

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<bool>::Resize(RepeatedField<bool> *this,int new_size,bool *value)

{
  bool *pbVar1;
  int in_ESI;
  int *in_RDI;
  bool *in_stack_ffffffffffffff80;
  RepeatedField<bool> *in_stack_ffffffffffffffe0;
  
  if (*in_RDI < in_ESI) {
    Reserve(this,new_size);
    pbVar1 = elements(in_stack_ffffffffffffffe0);
    pbVar1 = pbVar1 + *in_RDI;
    elements(in_stack_ffffffffffffffe0);
    std::fill<bool*,bool>(in_stack_ffffffffffffff80,pbVar1,(bool *)0x42626a);
  }
  *in_RDI = in_ESI;
  return;
}

Assistant:

inline void RepeatedField<Element>::Resize(int new_size, const Element& value) {
  GOOGLE_DCHECK_GE(new_size, 0);
  if (new_size > current_size_) {
    Reserve(new_size);
    std::fill(&elements()[current_size_], &elements()[new_size], value);
  }
  current_size_ = new_size;
}